

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

void copy_slays(_Bool **dest,_Bool *source)

{
  slay_conflict *psVar1;
  _Bool _Var2;
  _Bool *p_Var3;
  _Bool *p_Var4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (source != (_Bool *)0x0) {
    if (*dest == (_Bool *)0x0) {
      p_Var3 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
      *dest = p_Var3;
    }
    uVar7 = (ulong)z_info->slay_max;
    if (uVar7 != 0) {
      p_Var3 = *dest;
      uVar5 = 0;
      do {
        p_Var3[uVar5] = (_Bool)(p_Var3[uVar5] | source[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          p_Var3 = *dest;
          psVar1 = slays + uVar5;
          piVar6 = &slays->multiplier;
          uVar8 = 0;
          do {
            if ((p_Var3[uVar5] == true) && (p_Var3[uVar8] == true)) {
              _Var2 = same_monsters_slain((wchar_t)uVar5,(wchar_t)uVar8);
              if (_Var2) {
                p_Var4 = p_Var3 + uVar8;
                if (psVar1->multiplier < *piVar6) {
                  p_Var4 = p_Var3 + uVar5;
                }
                *p_Var4 = false;
              }
            }
            uVar8 = uVar8 + 1;
            piVar6 = piVar6 + 0xe;
          } while (uVar5 != uVar8);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar7);
    }
  }
  return;
}

Assistant:

void copy_slays(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest)) {
		*dest = mem_zalloc(z_info->slay_max * sizeof(bool));
	}

	/* Copy */
	for (i = 0; i < z_info->slay_max; i++) {
		(*dest)[i] |= source[i];
	}

	/* Check for duplicates */
	for (i = 0; i < z_info->slay_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] && same_monsters_slain(i, j)) {
				if (slays[i].multiplier < slays[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}